

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::DepthStencilTests::init(DepthStencilTests *this,EVP_PKEY_CTX *ctx)

{
  FaceType FVar1;
  deUint32 dVar2;
  undefined8 uVar3;
  Context *pCVar4;
  deInt32 a;
  int iVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  uint uVar8;
  TestNode *pTVar9;
  ostream *poVar10;
  ostringstream *this_00;
  DepthStencilCase *pDVar11;
  ulong uVar12;
  long lVar13;
  uint *puVar14;
  char *pcVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  float fVar20;
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  cases;
  DepthStencilParams params;
  Random rnd;
  ostringstream name;
  bool bStack_1a4;
  undefined3 uStack_1a3;
  
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "stencil_depth_funcs","Combinations of Depth and Stencil Functions");
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  for (lVar16 = 0; lVar16 != 9; lVar16 = lVar16 + 1) {
    for (lVar13 = 0; lVar13 != 9; lVar13 = lVar13 + 1) {
      params.visibleFace = FACETYPE_LAST;
      params.stencilTestEnabled = false;
      params.stencil[1].depthPassOp._0_1_ = 0;
      params._57_8_ = 0;
      params.stencil[1].reference = 0;
      params.stencil[1].compareMask = 0;
      params.stencil[1].stencilFailOp._0_1_ = 0;
      params.stencil[1]._13_7_ = 0;
      params.stencil[0].depthFailOp = 0;
      params.stencil[0].depthPassOp = 0;
      params.stencil[0].writeMask = 0;
      params.stencil[1].function = 0;
      params.stencil[0].function = 0;
      params.stencil[0].reference = 0;
      params.stencil[0].compareMask = 0;
      params.stencil[0].stencilFailOp = 0;
      params.depthWriteMask = false;
      params.depthFunc = 0;
      params.depth = 0.0;
      this_00 = (ostringstream *)&name;
      std::__cxx11::ostringstream::ostringstream(this_00);
      pcVar15 = "no_stencil_";
      if (lVar16 != 8) {
        poVar10 = std::operator<<((ostream *)&name,"stencil_");
        this_00 = (ostringstream *)std::operator<<(poVar10,init::compareFuncs[lVar16].name);
        pcVar15 = "_";
      }
      std::operator<<((ostream *)this_00,pcVar15);
      if (lVar13 == 8) {
        dVar6 = 0;
        std::operator<<((ostream *)&name,"no_depth");
      }
      else {
        poVar10 = std::operator<<((ostream *)&name,"depth_");
        std::operator<<(poVar10,init::compareFuncs[lVar13].name);
        dVar6 = init::compareFuncs[lVar13].func;
      }
      params.depthFunc = dVar6;
      params.depthTestEnabled = lVar13 != 8;
      params.depthWriteMask = true;
      params.stencilTestEnabled = lVar16 != 8;
      cases.
      super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      cases.
      super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      cases.
      super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (lVar17 = 0; lVar17 != 0x80; lVar17 = lVar17 + 0x20) {
        dVar6 = 0;
        FVar1 = *(FaceType *)((long)&init::functionCases[0].visibleFace + lVar17);
        uVar12 = (ulong)FVar1;
        params.depth = *(float *)((long)&init::functionCases[0].depth + lVar17);
        params.visibleFace = FVar1;
        if (lVar16 != 8) {
          dVar6 = init::compareFuncs[lVar16].func;
        }
        bVar19 = uVar12 == 0;
        params.stencil[uVar12].function = dVar6;
        params.stencil[uVar12].reference =
             *(int *)((long)&init::functionCases[0].stencilRef + lVar17);
        uVar3 = *(undefined8 *)((long)&init::functionCases[0].sFail + lVar17);
        params.stencil[uVar12].stencilFailOp = (int)uVar3;
        params.stencil[uVar12].depthFailOp = (int)((ulong)uVar3 >> 0x20);
        params.stencil[uVar12].depthPassOp =
             *(deUint32 *)((long)&init::functionCases[0].dPass + lVar17);
        params.stencil[uVar12].compareMask = 0xffffffff;
        params.stencil[uVar12].writeMask = 0xffffffff;
        params.stencil[bVar19].depthFailOp = 0x1e01;
        params.stencil[bVar19].depthPassOp = 0x1e01;
        params.stencil[bVar19].function = 0x207;
        params.stencil[bVar19].reference = 0;
        params.stencil[bVar19].compareMask = 0;
        params.stencil[bVar19].stencilFailOp = 0x1e01;
        params.stencil[bVar19].writeMask = 0xffffffff;
        std::
        vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
        ::push_back(&cases,&params);
      }
      pDVar11 = (DepthStencilCase *)operator_new(0x148);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::stringbuf::str();
      DepthStencilCase::DepthStencilCase(pDVar11,pCVar4,(char *)rnd.m_rnd._0_8_,"",&cases);
      tcu::TestNode::addChild(pTVar9,(TestNode *)pDVar11);
      std::__cxx11::string::~string((string *)&rnd);
      std::
      _Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
      ::~_Vector_base(&cases.
                       super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                     );
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
    }
  }
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"stencil_ops",
             "Stencil Op Combinations");
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  for (lVar16 = 0; lVar16 != 8; lVar16 = lVar16 + 1) {
    for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
      for (lVar17 = 0; lVar17 != 8; lVar17 = lVar17 + 1) {
        params.visibleFace = FACETYPE_LAST;
        params.stencilTestEnabled = false;
        params.stencil[1].depthPassOp._0_1_ = 0;
        params._57_8_ = 0;
        params.stencil[1].reference = 0;
        params.stencil[1].compareMask = 0;
        params.stencil[1].stencilFailOp._0_1_ = 0;
        params.stencil[1]._13_7_ = 0;
        params.stencil[0].depthFailOp = 0;
        params.stencil[0].depthPassOp = 0;
        params.stencil[0].writeMask = 0;
        params.stencil[1].function = 0;
        params.stencil[0].function = 0;
        params.stencil[0].reference = 0;
        params.stencil[0].compareMask = 0;
        params.stencil[0].stencilFailOp = 0;
        params.depthWriteMask = false;
        params.depthFunc = 0;
        params.depth = 0.0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
        poVar10 = std::operator<<((ostream *)&name,init::stencilOps[lVar16].name);
        poVar10 = std::operator<<(poVar10,"_");
        poVar10 = std::operator<<(poVar10,init::stencilOps[lVar13].name);
        poVar10 = std::operator<<(poVar10,"_");
        std::operator<<(poVar10,init::stencilOps[lVar17].name);
        params.depthFunc = 0x203;
        params.depth = 0.0;
        params.depthTestEnabled = true;
        params.depthWriteMask = true;
        params.stencilTestEnabled = true;
        cases.
        super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        cases.
        super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        cases.
        super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        dVar6 = init::stencilOps[lVar16].op;
        dVar7 = init::stencilOps[lVar13].op;
        dVar2 = init::stencilOps[lVar17].op;
        for (lVar18 = 0x10; lVar18 != 0x60; lVar18 = lVar18 + 0x14) {
          FVar1 = *(FaceType *)((long)&init::functionCases[3].stencilRef + lVar18);
          uVar12 = (ulong)FVar1;
          bVar19 = uVar12 == 0;
          params.visibleFace = FVar1;
          uVar3 = *(undefined8 *)((long)&init::functionCases[3].compareMask + lVar18);
          params.stencil[uVar12].function = (int)uVar3;
          params.stencil[uVar12].reference = (int)((ulong)uVar3 >> 0x20);
          params.stencil[uVar12].stencilFailOp = dVar6;
          params.stencil[uVar12].depthFailOp = dVar7;
          params.stencil[uVar12].depthPassOp = dVar2;
          params.stencil[uVar12].compareMask =
               *(deUint32 *)((long)&init::functionCases[3].depth + lVar18);
          params.stencil[uVar12].writeMask =
               *(deUint32 *)((long)&init::opCombinationCases[0].visibleFace + lVar18);
          params.stencil[bVar19].depthFailOp = 0x1e01;
          params.stencil[bVar19].depthPassOp = 0x1e01;
          params.stencil[bVar19].function = 0x207;
          params.stencil[bVar19].reference = 0;
          params.stencil[bVar19].compareMask = 0;
          params.stencil[bVar19].stencilFailOp = 0x1e01;
          params.stencil[bVar19].writeMask = 0xffffffff;
          std::
          vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
          ::push_back(&cases,&params);
        }
        pDVar11 = (DepthStencilCase *)operator_new(0x148);
        pCVar4 = (this->super_TestCaseGroup).m_context;
        std::__cxx11::stringbuf::str();
        DepthStencilCase::DepthStencilCase(pDVar11,pCVar4,(char *)rnd.m_rnd._0_8_,"",&cases);
        tcu::TestNode::addChild(pTVar9,(TestNode *)pDVar11);
        std::__cxx11::string::~string((string *)&rnd);
        std::
        _Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
        ::~_Vector_base(&cases.
                         super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                       );
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
      }
    }
  }
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"write_mask",
             "Depth and Stencil Write Masks");
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  params.visibleFace = FACETYPE_FRONT;
  params.stencilTestEnabled = false;
  params._5_3_ = 0;
  params.stencil[0].function = 0;
  params.stencil[0].reference = 0;
  params.stencil[0].compareMask = 0;
  params.stencil[0].stencilFailOp = 0;
  _name = FACETYPE_FRONT;
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ::push_back((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
               *)&params,(value_type *)&name);
  _name = FACETYPE_FRONT;
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ::push_back((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
               *)&params,(value_type *)&name);
  _name = FACETYPE_BACK;
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ::push_back((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
               *)&params,(value_type *)&name);
  _name = FACETYPE_BACK;
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ::push_back((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
               *)&params,(value_type *)&name);
  pDVar11 = (DepthStencilCase *)operator_new(0x148);
  DepthStencilCase::DepthStencilCase
            (pDVar11,(this->super_TestCaseGroup).m_context,"depth","Depth Write Mask",
             (vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
              *)&params);
  tcu::TestNode::addChild(pTVar9,(TestNode *)pDVar11);
  std::
  _Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ::~_Vector_base((_Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                   *)&params);
  _name = FACETYPE_LAST;
  params.stencil[0].compareMask = 0;
  params.stencil[0].stencilFailOp = 0;
  params.visibleFace = FACETYPE_FRONT;
  params.stencilTestEnabled = false;
  params._5_3_ = 0;
  params.stencil[0].function = 0;
  params.stencil[0].reference = 0;
  for (lVar16 = 8; lVar16 != 0x68; lVar16 = lVar16 + 0xc) {
    _name = *(FaceType *)((long)&init::opCombinationCases[3].compareMask + lVar16);
    std::
    vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
    ::push_back((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                 *)&params,(value_type *)&name);
  }
  pDVar11 = (DepthStencilCase *)operator_new(0x148);
  DepthStencilCase::DepthStencilCase
            (pDVar11,(this->super_TestCaseGroup).m_context,"stencil","Stencil Write Mask",
             (vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
              *)&params);
  tcu::TestNode::addChild(pTVar9,(TestNode *)pDVar11);
  std::
  _Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ::~_Vector_base((_Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                   *)&params);
  _name = FACETYPE_LAST;
  _bStack_1a4 = CONCAT31(uStack_1a3,true);
  params.stencil[0].compareMask = 0;
  params.stencil[0].stencilFailOp = 0;
  params.visibleFace = FACETYPE_FRONT;
  params.stencilTestEnabled = false;
  params._5_3_ = 0;
  params.stencil[0].function = 0;
  params.stencil[0].reference = 0;
  for (lVar16 = 0xc; lVar16 != 0xcc; lVar16 = lVar16 + 0x10) {
    _name = *(FaceType *)((long)&init::stencilWmaskCases[7].frontWriteMask + lVar16);
    std::
    vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
    ::push_back((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                 *)&params,(value_type *)&name);
  }
  pDVar11 = (DepthStencilCase *)operator_new(0x148);
  DepthStencilCase::DepthStencilCase
            (pDVar11,(this->super_TestCaseGroup).m_context,"both","Depth and Stencil Write Masks",
             (vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
              *)&params);
  tcu::TestNode::addChild(pTVar9,(TestNode *)pDVar11);
  std::
  _Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ::~_Vector_base((_Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                   *)&params);
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"random",
             "Randomized Depth and Stencil Test Cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  iVar5 = 0;
  do {
    cases.
    super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(cases.
                           super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar5);
    if (0x18 < iVar5) {
      return iVar5;
    }
    std::
    vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
    ::vector((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
              *)&params,10,(allocator_type *)&name);
    a = (deInt32)cases.
                 super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    iVar5 = tcu::CommandLine::getBaseSeed
                      (((this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx)->
                       m_cmdLine);
    dVar6 = deInt32Hash(a);
    dVar7 = deInt32Hash(iVar5);
    deRandom_init(&rnd.m_rnd,dVar6 ^ dVar7);
    for (puVar14 = (uint *)params._0_8_; puVar14 != (uint *)params.stencil[0]._0_8_;
        puVar14 = puVar14 + 0x14) {
      bVar19 = de::Random::getBool((Random *)&rnd.m_rnd);
      *puVar14 = (uint)!bVar19;
      fVar20 = deRandom_getFloat(&rnd.m_rnd);
      *(bool *)(puVar14 + 1) = fVar20 < 0.8;
      if (0.8 <= fVar20) {
        *(undefined1 *)(puVar14 + 0x10) = 1;
LAB_003d4b05:
        uVar8 = de::Random::choose<unsigned_int,unsigned_int_const*>
                          ((Random *)&rnd.m_rnd,
                           (uint *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                                   ::compareFuncs,
                           (uint *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                                   ::stencilOps);
        puVar14[0x11] = uVar8;
        fVar20 = de::Random::choose<float,float_const*>
                           ((Random *)&rnd.m_rnd,
                            (float *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                                     ::depthValues,(float *)&DAT_005d162c);
        puVar14[0x12] = (uint)fVar20;
        bVar19 = de::Random::getBool((Random *)&rnd.m_rnd);
        *(bool *)(puVar14 + 0x13) = bVar19;
      }
      else {
        fVar20 = deRandom_getFloat(&rnd.m_rnd);
        *(bool *)(puVar14 + 0x10) = fVar20 < 0.7;
        if ((puVar14[1] & 1) == 0) {
          if (fVar20 < 0.7) goto LAB_003d4b05;
        }
        else {
          for (lVar16 = 0x20; lVar16 != 0x58; lVar16 = lVar16 + 0x1c) {
            uVar8 = de::Random::choose<unsigned_int,unsigned_int_const*>
                              ((Random *)&rnd.m_rnd,
                               (uint *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                                       ::compareFuncs,
                               (uint *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                                       ::stencilOps);
            *(uint *)((long)puVar14 + lVar16 + -0x18) = uVar8;
            dVar6 = deRandom_getUint32(&rnd.m_rnd);
            *(uint *)((long)puVar14 + lVar16 + -0x14) = dVar6 % 0x107 - 2;
            dVar6 = deRandom_getUint32(&rnd.m_rnd);
            *(deUint32 *)((long)puVar14 + lVar16 + -0x10) = dVar6;
            uVar8 = de::Random::choose<unsigned_int,unsigned_int_const*>
                              ((Random *)&rnd.m_rnd,
                               (uint *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                                       ::stencilOps,
                               (uint *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                                       ::depthValues);
            *(uint *)((long)puVar14 + lVar16 + -0xc) = uVar8;
            uVar8 = de::Random::choose<unsigned_int,unsigned_int_const*>
                              ((Random *)&rnd.m_rnd,
                               (uint *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                                       ::stencilOps,
                               (uint *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                                       ::depthValues);
            *(uint *)((long)puVar14 + lVar16 + -8) = uVar8;
            uVar8 = de::Random::choose<unsigned_int,unsigned_int_const*>
                              ((Random *)&rnd.m_rnd,
                               (uint *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                                       ::stencilOps,
                               (uint *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                                       ::depthValues);
            *(uint *)((long)puVar14 + lVar16 + -4) = uVar8;
            dVar6 = deRandom_getUint32(&rnd.m_rnd);
            *(deUint32 *)((long)puVar14 + lVar16) = dVar6;
          }
          if ((puVar14[0x10] & 1) != 0) goto LAB_003d4b05;
        }
      }
    }
    pDVar11 = (DepthStencilCase *)operator_new(0x148);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    de::toString<int>((string *)&name,(int *)&cases);
    DepthStencilCase::DepthStencilCase
              (pDVar11,pCVar4,(char *)CONCAT44(_bStack_1a4,_name),"",
               (vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                *)&params);
    tcu::TestNode::addChild(pTVar9,(TestNode *)pDVar11);
    std::__cxx11::string::~string((string *)&name);
    std::
    _Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
    ::~_Vector_base((_Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                     *)&params);
    iVar5 = (deInt32)cases.
                     super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1;
  } while( true );
}

Assistant:

void DepthStencilTests::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	func;
	} compareFuncs[] =
	{
		{ "never",		GL_NEVER	},
		{ "always",		GL_ALWAYS	},
		{ "less",		GL_LESS		},
		{ "lequal",		GL_LEQUAL	},
		{ "equal",		GL_EQUAL	},
		{ "gequal",		GL_GEQUAL	},
		{ "greater",	GL_GREATER	},
		{ "notequal",	GL_NOTEQUAL	}
	};

	static const struct
	{
		const char*	name;
		deUint32	op;
	} stencilOps[] =
	{
		{ "keep",		GL_KEEP			},
		{ "zero",		GL_ZERO			},
		{ "replace",	GL_REPLACE		},
		{ "incr",		GL_INCR			},
		{ "decr",		GL_DECR			},
		{ "invert",		GL_INVERT		},
		{ "incr_wrap",	GL_INCR_WRAP	},
		{ "decr_wrap",	GL_DECR_WRAP	}
	};

	static const struct
	{
		rr::FaceType	visibleFace;
		deUint32		sFail;
		deUint32		dFail;
		deUint32		dPass;
		int				stencilRef;
		deUint32		compareMask;
		deUint32		writeMask;
		float			depth;
	} functionCases[] =
	{
		{ rr::FACETYPE_BACK,	GL_DECR,		GL_INCR,	GL_INVERT,		4,	~0u, ~0u,	-0.7f },
		{ rr::FACETYPE_FRONT,	GL_DECR,		GL_INCR,	GL_INVERT,		2,	~0u, ~0u,	0.0f },
		{ rr::FACETYPE_BACK,	GL_DECR,		GL_INCR,	GL_INVERT,		1,	~0u, ~0u,	0.2f },
		{ rr::FACETYPE_FRONT,	GL_DECR_WRAP,	GL_INVERT,	GL_REPLACE,		4,	~0u, ~0u,	1.0f }
	};

	// All combinations of depth stencil functions.
	{
		tcu::TestCaseGroup* functionsGroup = new tcu::TestCaseGroup(m_testCtx, "stencil_depth_funcs", "Combinations of Depth and Stencil Functions");
		addChild(functionsGroup);

		for (int stencilFunc = 0; stencilFunc < DE_LENGTH_OF_ARRAY(compareFuncs)+1; stencilFunc++)
		{
			// One extra: depth test disabled.
			for (int depthFunc = 0; depthFunc < DE_LENGTH_OF_ARRAY(compareFuncs)+1; depthFunc++)
			{
				DepthStencilParams	params;
				ostringstream		name;
				bool				hasStencilFunc	= de::inBounds(stencilFunc, 0, DE_LENGTH_OF_ARRAY(compareFuncs));
				bool				hasDepthFunc	= de::inBounds(depthFunc, 0, DE_LENGTH_OF_ARRAY(compareFuncs));

				if (hasStencilFunc)
					name << "stencil_" << compareFuncs[stencilFunc].name << "_";
				else
					name << "no_stencil_";

				if (hasDepthFunc)
					name << "depth_" << compareFuncs[depthFunc].name;
				else
					name << "no_depth";

				params.depthFunc			= hasDepthFunc ? compareFuncs[depthFunc].func : 0;
				params.depthTestEnabled		= hasDepthFunc;
				params.depthWriteMask		= true;

				params.stencilTestEnabled	= hasStencilFunc;

				vector<DepthStencilParams> cases;
				for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(functionCases); ndx++)
				{
					rr::FaceType	visible		= functionCases[ndx].visibleFace;
					rr::FaceType	notVisible	= visible == rr::FACETYPE_FRONT ? rr::FACETYPE_BACK : rr::FACETYPE_FRONT;

					params.depth								= functionCases[ndx].depth;
					params.visibleFace							= visible;

					params.stencil[visible].function			= hasStencilFunc ? compareFuncs[stencilFunc].func : 0;
					params.stencil[visible].reference			= functionCases[ndx].stencilRef;
					params.stencil[visible].stencilFailOp		= functionCases[ndx].sFail;
					params.stencil[visible].depthFailOp			= functionCases[ndx].dFail;
					params.stencil[visible].depthPassOp			= functionCases[ndx].dPass;
					params.stencil[visible].compareMask			= functionCases[ndx].compareMask;
					params.stencil[visible].writeMask			= functionCases[ndx].writeMask;

					params.stencil[notVisible].function			= GL_ALWAYS;
					params.stencil[notVisible].reference		= 0;
					params.stencil[notVisible].stencilFailOp	= GL_REPLACE;
					params.stencil[notVisible].depthFailOp		= GL_REPLACE;
					params.stencil[notVisible].depthPassOp		= GL_REPLACE;
					params.stencil[notVisible].compareMask		= 0u;
					params.stencil[notVisible].writeMask		= ~0u;


					cases.push_back(params);
				}

				functionsGroup->addChild(new DepthStencilCase(m_context, name.str().c_str(), "", cases));
			}
		}
	}

	static const struct
	{
		rr::FaceType	visibleFace;
		deUint32		func;
		int				ref;
		deUint32		compareMask;
		deUint32		writeMask;
	} opCombinationCases[] =
	{
		{ rr::FACETYPE_BACK,	GL_LESS,		4,		~0u,	~0u	},
		{ rr::FACETYPE_FRONT,	GL_GREATER,		2,		~0u,	~0u	},
		{ rr::FACETYPE_BACK,	GL_EQUAL,		3,		~2u,	~0u	},
		{ rr::FACETYPE_FRONT,	GL_NOTEQUAL,	1,		~0u,	~1u	}
	};

	// All combinations of stencil ops.
	{
		tcu::TestCaseGroup* opCombinationGroup = new tcu::TestCaseGroup(m_testCtx, "stencil_ops", "Stencil Op Combinations");
		addChild(opCombinationGroup);

		for (int sFail = 0; sFail < DE_LENGTH_OF_ARRAY(stencilOps); sFail++)
		{
			for (int dFail = 0; dFail < DE_LENGTH_OF_ARRAY(stencilOps); dFail++)
			{
				for (int dPass = 0; dPass < DE_LENGTH_OF_ARRAY(stencilOps); dPass++)
				{
					DepthStencilParams	params;
					ostringstream		name;

					name << stencilOps[sFail].name << "_" << stencilOps[dFail].name << "_" << stencilOps[dPass].name;

					params.depthFunc			= GL_LEQUAL;
					params.depth				= 0.0f;
					params.depthTestEnabled		= true;
					params.depthWriteMask		= true;

					params.stencilTestEnabled	= true;

					vector<DepthStencilParams> cases;
					for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(opCombinationCases); ndx++)
					{
						rr::FaceType	visible		= opCombinationCases[ndx].visibleFace;
						rr::FaceType	notVisible	= visible == rr::FACETYPE_FRONT ? rr::FACETYPE_BACK : rr::FACETYPE_FRONT;

						params.visibleFace							= visible;

						params.stencil[visible].function			= opCombinationCases[ndx].func;
						params.stencil[visible].reference			= opCombinationCases[ndx].ref;
						params.stencil[visible].stencilFailOp		= stencilOps[sFail].op;
						params.stencil[visible].depthFailOp			= stencilOps[dFail].op;
						params.stencil[visible].depthPassOp			= stencilOps[dPass].op;
						params.stencil[visible].compareMask			= opCombinationCases[ndx].compareMask;
						params.stencil[visible].writeMask			= opCombinationCases[ndx].writeMask;

						params.stencil[notVisible].function			= GL_ALWAYS;
						params.stencil[notVisible].reference		= 0;
						params.stencil[notVisible].stencilFailOp	= GL_REPLACE;
						params.stencil[notVisible].depthFailOp		= GL_REPLACE;
						params.stencil[notVisible].depthPassOp		= GL_REPLACE;
						params.stencil[notVisible].compareMask		= 0u;
						params.stencil[notVisible].writeMask		= ~0u;


						cases.push_back(params);
					}

					opCombinationGroup->addChild(new DepthStencilCase(m_context, name.str().c_str(), "", cases));
				}
			}
		}
	}

	// Write masks
	{
		tcu::TestCaseGroup* writeMaskGroup = new tcu::TestCaseGroup(m_testCtx, "write_mask", "Depth and Stencil Write Masks");
		addChild(writeMaskGroup);

		// Depth mask
		{
			DepthStencilParams params;

			params.depthFunc			= GL_LEQUAL;
			params.depth				= 0.0f;
			params.depthTestEnabled		= true;
			params.stencilTestEnabled	= true;

			params.stencil[rr::FACETYPE_FRONT].function			= GL_NOTEQUAL;
			params.stencil[rr::FACETYPE_FRONT].reference		= 1;
			params.stencil[rr::FACETYPE_FRONT].stencilFailOp	= GL_INVERT;
			params.stencil[rr::FACETYPE_FRONT].depthFailOp		= GL_INCR;
			params.stencil[rr::FACETYPE_FRONT].depthPassOp		= GL_DECR;
			params.stencil[rr::FACETYPE_FRONT].compareMask		= ~0u;
			params.stencil[rr::FACETYPE_FRONT].writeMask		= ~0u;

			params.stencil[rr::FACETYPE_BACK].function			= GL_ALWAYS;
			params.stencil[rr::FACETYPE_BACK].reference			= 0;
			params.stencil[rr::FACETYPE_BACK].stencilFailOp		= GL_REPLACE;
			params.stencil[rr::FACETYPE_BACK].depthFailOp		= GL_INVERT;
			params.stencil[rr::FACETYPE_BACK].depthPassOp		= GL_INCR;
			params.stencil[rr::FACETYPE_BACK].compareMask		= ~0u;
			params.stencil[rr::FACETYPE_BACK].writeMask			= ~0u;

			vector<DepthStencilParams> cases;

			// Case 1: front, depth write enabled
			params.visibleFace		= rr::FACETYPE_FRONT;
			params.depthWriteMask	= true;
			cases.push_back(params);

			// Case 2: front, depth write disabled
			params.visibleFace		= rr::FACETYPE_FRONT;
			params.depthWriteMask	= false;
			cases.push_back(params);

			// Case 3: back, depth write enabled
			params.visibleFace		= rr::FACETYPE_BACK;
			params.depthWriteMask	= true;
			cases.push_back(params);

			// Case 4: back, depth write disabled
			params.visibleFace		= rr::FACETYPE_BACK;
			params.depthWriteMask	= false;
			cases.push_back(params);

			writeMaskGroup->addChild(new DepthStencilCase(m_context, "depth", "Depth Write Mask", cases));
		}

		// Stencil write masks.
		{
			static const struct
			{
				rr::FaceType	visibleFace;
				deUint32		frontWriteMask;
				deUint32		backWriteMask;
			} stencilWmaskCases[] =
			{
				{ rr::FACETYPE_FRONT,	~0u,	0u		},
				{ rr::FACETYPE_FRONT,	0u,		~0u		},
				{ rr::FACETYPE_FRONT,	0xfu,	0xf0u	},
				{ rr::FACETYPE_FRONT,	0x2u,	0x4u	},
				{ rr::FACETYPE_BACK,	0u,		~0u		},
				{ rr::FACETYPE_BACK,	~0u,	0u		},
				{ rr::FACETYPE_BACK,	0xf0u,	0xfu	},
				{ rr::FACETYPE_BACK,	0x4u,	0x2u	}
			};

			DepthStencilParams params;

			params.depthFunc			= GL_LEQUAL;
			params.depth				= 0.0f;
			params.depthTestEnabled		= true;
			params.depthWriteMask		= true;
			params.stencilTestEnabled	= true;

			params.stencil[rr::FACETYPE_FRONT].function			= GL_NOTEQUAL;
			params.stencil[rr::FACETYPE_FRONT].reference		= 1;
			params.stencil[rr::FACETYPE_FRONT].stencilFailOp	= GL_INVERT;
			params.stencil[rr::FACETYPE_FRONT].depthFailOp		= GL_INCR;
			params.stencil[rr::FACETYPE_FRONT].depthPassOp		= GL_DECR;
			params.stencil[rr::FACETYPE_FRONT].compareMask		= ~0u;

			params.stencil[rr::FACETYPE_BACK].function			= GL_ALWAYS;
			params.stencil[rr::FACETYPE_BACK].reference			= 0;
			params.stencil[rr::FACETYPE_BACK].stencilFailOp		= GL_REPLACE;
			params.stencil[rr::FACETYPE_BACK].depthFailOp		= GL_INVERT;
			params.stencil[rr::FACETYPE_BACK].depthPassOp		= GL_INCR;
			params.stencil[rr::FACETYPE_BACK].compareMask		= ~0u;

			vector<DepthStencilParams> cases;
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(stencilWmaskCases); ndx++)
			{
				params.visibleFace								= stencilWmaskCases[ndx].visibleFace;
				params.stencil[rr::FACETYPE_FRONT].writeMask	= stencilWmaskCases[ndx].frontWriteMask;
				params.stencil[rr::FACETYPE_BACK].writeMask		= stencilWmaskCases[ndx].backWriteMask;
				cases.push_back(params);
			}

			writeMaskGroup->addChild(new DepthStencilCase(m_context, "stencil", "Stencil Write Mask", cases));
		}

		// Depth & stencil write masks.
		{
			static const struct
			{
				bool			depthWriteMask;
				rr::FaceType	visibleFace;
				deUint32		frontWriteMask;
				deUint32		backWriteMask;
			} depthStencilWmaskCases[] =
			{
				{ false,	rr::FACETYPE_FRONT,		~0u,	0u		},
				{ false,	rr::FACETYPE_FRONT,		0u,		~0u		},
				{ false,	rr::FACETYPE_FRONT,		0xfu,	0xf0u	},
				{ true,		rr::FACETYPE_FRONT,		~0u,	0u		},
				{ true,		rr::FACETYPE_FRONT,		0u,		~0u		},
				{ true,		rr::FACETYPE_FRONT,		0xfu,	0xf0u	},
				{ false,	rr::FACETYPE_BACK,		0u,		~0u		},
				{ false,	rr::FACETYPE_BACK,		~0u,	0u		},
				{ false,	rr::FACETYPE_BACK,		0xf0u,	0xfu	},
				{ true,		rr::FACETYPE_BACK,		0u,		~0u		},
				{ true,		rr::FACETYPE_BACK,		~0u,	0u		},
				{ true,		rr::FACETYPE_BACK,		0xf0u,	0xfu	}
			};

			DepthStencilParams params;

			params.depthFunc			= GL_LEQUAL;
			params.depth				= 0.0f;
			params.depthTestEnabled		= true;
			params.depthWriteMask		= true;
			params.stencilTestEnabled	= true;

			params.stencil[rr::FACETYPE_FRONT].function			= GL_NOTEQUAL;
			params.stencil[rr::FACETYPE_FRONT].reference		= 1;
			params.stencil[rr::FACETYPE_FRONT].stencilFailOp	= GL_INVERT;
			params.stencil[rr::FACETYPE_FRONT].depthFailOp		= GL_INCR;
			params.stencil[rr::FACETYPE_FRONT].depthPassOp		= GL_DECR;
			params.stencil[rr::FACETYPE_FRONT].compareMask		= ~0u;

			params.stencil[rr::FACETYPE_BACK].function			= GL_ALWAYS;
			params.stencil[rr::FACETYPE_BACK].reference			= 0;
			params.stencil[rr::FACETYPE_BACK].stencilFailOp		= GL_REPLACE;
			params.stencil[rr::FACETYPE_BACK].depthFailOp		= GL_INVERT;
			params.stencil[rr::FACETYPE_BACK].depthPassOp		= GL_INCR;
			params.stencil[rr::FACETYPE_BACK].compareMask		= ~0u;

			vector<DepthStencilParams> cases;
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthStencilWmaskCases); ndx++)
			{
				params.depthWriteMask							= depthStencilWmaskCases[ndx].depthWriteMask;
				params.visibleFace								= depthStencilWmaskCases[ndx].visibleFace;
				params.stencil[rr::FACETYPE_FRONT].writeMask	= depthStencilWmaskCases[ndx].frontWriteMask;
				params.stencil[rr::FACETYPE_BACK].writeMask		= depthStencilWmaskCases[ndx].backWriteMask;
				cases.push_back(params);
			}

			writeMaskGroup->addChild(new DepthStencilCase(m_context, "both", "Depth and Stencil Write Masks", cases));
		}
	}

	// Randomized cases
	{
		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Randomized Depth and Stencil Test Cases");
		addChild(randomGroup);

		for (int caseNdx = 0; caseNdx < NUM_RANDOM_CASES; caseNdx++)
		{
			vector<DepthStencilParams>	subCases	(NUM_RANDOM_SUB_CASES);
			de::Random					rnd			(deInt32Hash(caseNdx) ^ deInt32Hash(m_testCtx.getCommandLine().getBaseSeed()));

			for (vector<DepthStencilParams>::iterator iter = subCases.begin(); iter != subCases.end(); ++iter)
				randomDepthStencilState(rnd, *iter);

			randomGroup->addChild(new DepthStencilCase(m_context, de::toString(caseNdx).c_str(), "", subCases));
		}
	}
}